

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::anon_unknown_0::PositionColorShader::PositionColorShader
          (PositionColorShader *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ShaderProgramDeclaration *pSVar2;
  long *local_260;
  long local_258;
  long local_250 [2];
  VertexSource local_240;
  long *local_220;
  long local_218;
  long local_210 [2];
  long *local_200;
  long local_1f8;
  long local_1f0 [2];
  long *local_1e0;
  long local_1d8;
  long local_1d0 [2];
  FragmentOutput local_1bc;
  VertexAttribute local_1b8;
  VertexAttribute local_190;
  FragmentSource local_168;
  VertexToFragmentVarying local_148;
  ShaderProgramDeclaration local_140;
  
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_140);
  local_260 = local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"a_position","");
  local_190.name._M_dataplus._M_p = (pointer)&local_190.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,local_260,local_258 + (long)local_260);
  local_190.type = GENERICVECTYPE_FLOAT;
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,&local_190);
  local_1e0 = local_1d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"a_color","");
  local_1b8.name._M_dataplus._M_p = (pointer)&local_1b8.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,local_1e0,local_1d8 + (long)local_1e0);
  local_1b8.type = GENERICVECTYPE_FLOAT;
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_1b8);
  local_148.type = GENERICVECTYPE_FLOAT;
  local_148.flatshade = false;
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_148);
  local_1bc.type = GENERICVECTYPE_FLOAT;
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_1bc);
  local_200 = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_200,
             "#version 300 es\nin highp vec4 a_position;\nin highp vec4 a_color;\nout highp vec4 v_color;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_color = a_color;\n}\n"
             ,"");
  local_240.source._M_dataplus._M_p = (pointer)&local_240.source.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_240,local_200,local_1f8 + (long)local_200);
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_240);
  local_220 = local_210;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_220,
             "#version 300 es\nin highp vec4 v_color;\nlayout(location = 0) out mediump vec4 fragColor;void main (void)\n{\n\tfragColor = v_color;\n}\n"
             ,"");
  paVar1 = &local_168.source.field_2;
  local_168.source._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_168,local_220,local_218 + (long)local_220);
  pSVar2 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar2,&local_168);
  sglr::ShaderProgram::ShaderProgram(&this->super_ShaderProgram,pSVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168.source._M_dataplus._M_p != paVar1) {
    operator_delete(local_168.source._M_dataplus._M_p,
                    local_168.source.field_2._M_allocated_capacity + 1);
  }
  if (local_220 != local_210) {
    operator_delete(local_220,local_210[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240.source._M_dataplus._M_p != &local_240.source.field_2) {
    operator_delete(local_240.source._M_dataplus._M_p,
                    local_240.source.field_2._M_allocated_capacity + 1);
  }
  if (local_200 != local_1f0) {
    operator_delete(local_200,local_1f0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8.name._M_dataplus._M_p != &local_1b8.name.field_2) {
    operator_delete(local_1b8.name._M_dataplus._M_p,local_1b8.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_1e0 != local_1d0) {
    operator_delete(local_1e0,local_1d0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.name._M_dataplus._M_p != &local_190.name.field_2) {
    operator_delete(local_190.name._M_dataplus._M_p,local_190.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_260 != local_250) {
    operator_delete(local_260,local_250[0] + 1);
  }
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_140);
  (this->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_00d35e58;
  (this->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_00d35e90;
  (this->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_00d35ea8;
  return;
}

Assistant:

PositionColorShader::PositionColorShader (void)
	: sglr::ShaderProgram(sglr::pdec::ShaderProgramDeclaration()
							<< sglr::pdec::VertexAttribute("a_position", rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexAttribute("a_color", rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexAttribute("a_pointSize", rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexToFragmentVarying(rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::FragmentOutput(rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexSource(shaderSourceVertex)
							<< sglr::pdec::FragmentSource(shaderSourceFragment))
{
}